

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_buf.c
# Opt level: O2

void buf_grow(SBuf *sb,MSize sz)

{
  char *pcVar1;
  char *p;
  ulong uVar2;
  char *pcVar3;
  GCSize GVar4;
  char *__dest;
  GCSize nsz;
  ulong uVar5;
  
  pcVar1 = sb->w;
  p = sb->b;
  uVar5 = (long)sb->e - (long)p;
  GVar4 = 0x20;
  if (0x20 < (uint)uVar5) {
    GVar4 = uVar5 & 0xffffffff;
  }
  do {
    nsz = GVar4;
    GVar4 = (ulong)((uint)nsz * 2);
  } while ((uint)nsz < sz);
  uVar2 = (sb->L).ptr64;
  if ((uVar2 & 2) == 0) {
    __dest = (char *)lj_mem_realloc((lua_State *)(uVar2 & 0xfffffffffffffff8),p,uVar5 & 0xffffffff,
                                    nsz);
  }
  else {
    __dest = (char *)lj_mem_realloc((lua_State *)(uVar2 & 0xfffffffffffffff8),(void *)0x0,0,nsz);
    (sb->L).ptr64 = uVar2 & 0xfffffffffffffffd;
    sb[1].w = (char *)0x0;
    memcpy(__dest,sb->b,uVar5 & 0xffffffff);
  }
  if ((uVar2 & 1) != 0) {
    sb[1].e = __dest + ((long)sb[1].e - (long)sb->b);
  }
  sb->b = __dest;
  sb->w = __dest + ((long)pcVar1 - (long)p & 0xffffffff);
  sb->e = __dest + nsz;
  if ((uVar2 & 4) != 0) {
    pcVar3 = sb[1].w;
    *(char **)(pcVar3 + 0x10) = __dest;
    *(char **)pcVar3 = __dest + ((long)pcVar1 - (long)p & 0xffffffff);
    *(char **)(pcVar3 + 8) = __dest + nsz;
  }
  return;
}

Assistant:

static void buf_grow(SBuf *sb, MSize sz)
{
  MSize osz = sbufsz(sb), len = sbuflen(sb), nsz = osz;
  char *b;
  GCSize flag;
  if (nsz < LJ_MIN_SBUF) nsz = LJ_MIN_SBUF;
  while (nsz < sz) nsz += nsz;
  flag = sbufflag(sb);
  if ((flag & SBUF_FLAG_COW)) {  /* Copy-on-write semantics. */
    lj_assertG_(G(sbufL(sb)), sb->w == sb->e, "bad SBuf COW");
    b = (char *)lj_mem_new(sbufL(sb), nsz);
    setsbufflag(sb, flag & ~(GCSize)SBUF_FLAG_COW);
    setgcrefnull(sbufX(sb)->cowref);
    memcpy(b, sb->b, osz);
  } else {
    b = (char *)lj_mem_realloc(sbufL(sb), sb->b, osz, nsz);
  }
  if ((flag & SBUF_FLAG_EXT)) {
    sbufX(sb)->r = sbufX(sb)->r - sb->b + b;  /* Adjust read pointer, too. */
  }
  /* Adjust buffer pointers. */
  sb->b = b;
  sb->w = b + len;
  sb->e = b + nsz;
  if ((flag & SBUF_FLAG_BORROW)) {  /* Adjust borrowed buffer pointers. */
    SBuf *bsb = mref(sbufX(sb)->bsb, SBuf);
    bsb->b = b;
    bsb->w = b + len;
    bsb->e = b + nsz;
  }
}